

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall pbrt::SubstrateMaterial::readFrom(SubstrateMaterial *this,BinaryReader *binary)

{
  size_t sVar1;
  pointer puVar2;
  undefined8 uVar3;
  runtime_error *this_00;
  
  Material::readFrom(&this->super_Material,binary);
  sVar1 = binary->currentEntityOffset;
  puVar2 = (binary->currentEntityData).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)((long)(binary->currentEntityData).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"invalid read attempt by entity - not enough data in data block!");
  }
  else {
    (this->kd).z = *(float *)(puVar2 + sVar1 + 8);
    uVar3 = *(undefined8 *)(puVar2 + sVar1);
    (this->kd).x = (float)(int)uVar3;
    (this->kd).y = (float)(int)((ulong)uVar3 >> 0x20);
    binary->currentEntityOffset = binary->currentEntityOffset + 0xc;
    BinaryReader::read<pbrt::Texture>(binary,&this->map_kd);
    sVar1 = binary->currentEntityOffset;
    puVar2 = (binary->currentEntityData).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(binary->currentEntityData).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2) < sVar1 + 0xc) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"invalid read attempt by entity - not enough data in data block!");
    }
    else {
      (this->ks).z = *(float *)(puVar2 + sVar1 + 8);
      uVar3 = *(undefined8 *)(puVar2 + sVar1);
      (this->ks).x = (float)(int)uVar3;
      (this->ks).y = (float)(int)((ulong)uVar3 >> 0x20);
      binary->currentEntityOffset = binary->currentEntityOffset + 0xc;
      BinaryReader::read<pbrt::Texture>(binary,&this->map_ks);
      BinaryReader::read<pbrt::Texture>(binary,&this->map_bump);
      puVar2 = (binary->currentEntityData).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)((long)(binary->currentEntityData).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar2) <
          binary->currentEntityOffset + 4) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"invalid read attempt by entity - not enough data in data block!");
      }
      else {
        this->uRoughness = *(float *)(puVar2 + binary->currentEntityOffset);
        binary->currentEntityOffset = binary->currentEntityOffset + 4;
        BinaryReader::read<pbrt::Texture>(binary,&this->map_uRoughness);
        puVar2 = (binary->currentEntityData).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((ulong)((long)(binary->currentEntityData).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)puVar2) <
            binary->currentEntityOffset + 4) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"invalid read attempt by entity - not enough data in data block!");
        }
        else {
          this->vRoughness = *(float *)(puVar2 + binary->currentEntityOffset);
          binary->currentEntityOffset = binary->currentEntityOffset + 4;
          BinaryReader::read<pbrt::Texture>(binary,&this->map_vRoughness);
          puVar2 = (binary->currentEntityData).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (binary->currentEntityOffset + 1 <=
              (ulong)((long)(binary->currentEntityData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)puVar2)) {
            this->remapRoughness = (bool)puVar2[binary->currentEntityOffset];
            binary->currentEntityOffset = binary->currentEntityOffset + 1;
            return;
          }
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this_00,"invalid read attempt by entity - not enough data in data block!");
        }
      }
    }
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void SubstrateMaterial::readFrom(BinaryReader &binary) 
  {
    Material::readFrom(binary);
    binary.read(kd);
    binary.read(map_kd);
    binary.read(ks);
    binary.read(map_ks);
    binary.read(map_bump);
    binary.read(uRoughness);
    binary.read(map_uRoughness);
    binary.read(vRoughness);
    binary.read(map_vRoughness);
    binary.read(remapRoughness);
  }